

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_stdout_and_stderr_to_file2(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  uv_loop_t *loop;
  char *pcVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  char *pcVar8;
  int64_t eval_b_2;
  int64_t eval_b_6;
  int64_t eval_b;
  undefined8 local_210;
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open(0,&fs_req,"stdout_file",0x42,0x180,0);
  lVar3 = (long)iVar1;
  eval_b = 0;
  stdio[0]._0_8_ = lVar3;
  if (lVar3 == 0) {
    uv_fs_req_cleanup();
    iVar1 = dup2((int)fs_req.result,2);
    eval_b = -1;
    if (iVar1 == -1) {
      pcVar8 = "!=";
      pcVar6 = "-1";
      pcVar5 = "file";
      uVar4 = 0x1c5;
      lVar3 = -1;
      eval_b_6 = eval_b;
      stdio[0]._0_8_ = lVar3;
    }
    else {
      options.stdio = stdio;
      stdio[0]._4_4_ = iVar1 >> 0x1f;
      stdio[0]._0_8_ = (ulong)(uint)stdio[0]._4_4_ << 0x20;
      options.stdio_count = 3;
      stdio[1].flags = UV_INHERIT_FD;
      stdio[1].data._0_4_ = iVar1;
      stdio[2].flags = UV_INHERIT_FD;
      stdio[2].data._0_4_ = iVar1;
      uVar4 = uv_default_loop();
      iVar2 = uv_spawn(uVar4,&process,&options);
      eval_b = (int64_t)iVar2;
      eval_b_2 = 0;
      if (eval_b == 0) {
        uVar4 = uv_default_loop();
        iVar2 = uv_run(uVar4,0);
        eval_b = (int64_t)iVar2;
        eval_b_2 = 0;
        if (eval_b == 0) {
          eval_b = 1;
          eval_b_2 = (int64_t)exit_cb_called;
          if (eval_b_2 == 1) {
            eval_b = 1;
            eval_b_2 = (int64_t)close_cb_called;
            if (eval_b_2 == 1) {
              auVar7 = uv_buf_init(output,0x400);
              local_210 = auVar7._8_8_;
              eval_b = auVar7._0_8_;
              iVar2 = uv_fs_read(0,&fs_req,iVar1,&eval_b,1,0,0);
              eval_b_2 = 0x1b;
              eval_b_6 = (int64_t)iVar2;
              if (eval_b_6 == 0x1b) {
                uv_fs_req_cleanup(&fs_req);
                iVar1 = uv_fs_close(0,&fs_req,iVar1,0);
                eval_b_2 = (int64_t)iVar1;
                eval_b_6 = 0;
                if (eval_b_2 == 0) {
                  uv_fs_req_cleanup(&fs_req);
                  printf("output is: %s",output);
                  iVar1 = strcmp("hello world\nhello errworld\n",output);
                  eval_b_2 = (int64_t)iVar1;
                  eval_b_6 = 0;
                  if (eval_b_2 == 0) {
                    unlink("stdout_file");
                    loop = (uv_loop_t *)uv_default_loop();
                    close_loop(loop);
                    eval_b_2 = 0;
                    uVar4 = uv_default_loop();
                    iVar1 = uv_loop_close(uVar4);
                    eval_b_6 = (int64_t)iVar1;
                    if (eval_b_6 == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar6 = "uv_loop_close(uv_default_loop())";
                    pcVar5 = "0";
                    uVar4 = 0x1e7;
                  }
                  else {
                    pcVar6 = "0";
                    pcVar5 = "strcmp(\"hello world\\nhello errworld\\n\", output)";
                    uVar4 = 0x1e2;
                  }
                }
                else {
                  pcVar6 = "0";
                  pcVar5 = "r";
                  uVar4 = 0x1de;
                }
              }
              else {
                pcVar6 = "r";
                pcVar5 = "27";
                uVar4 = 0x1da;
              }
              pcVar8 = "==";
              lVar3 = eval_b_2;
              goto LAB_0017713c;
            }
            pcVar6 = "close_cb_called";
            pcVar5 = "1";
            uVar4 = 0x1d6;
          }
          else {
            pcVar6 = "exit_cb_called";
            pcVar5 = "1";
            uVar4 = 0x1d5;
          }
        }
        else {
          pcVar6 = "0";
          pcVar5 = "r";
          uVar4 = 0x1d3;
        }
      }
      else {
        pcVar6 = "0";
        pcVar5 = "r";
        uVar4 = 0x1d0;
      }
      pcVar8 = "==";
      lVar3 = eval_b;
      eval_b_6 = eval_b_2;
    }
  }
  else {
    pcVar8 = "==";
    pcVar6 = "0";
    pcVar5 = "r";
    uVar4 = 0x1c1;
    eval_b_6 = eval_b;
  }
LAB_0017713c:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar4,pcVar5,pcVar8,pcVar6,lVar3,pcVar8,eval_b_6);
  abort();
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file2) {
#ifndef _WIN32
  int r;
  uv_os_fd_t file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper6", exit_cb);

  /* Replace stderr with our file */
  r = uv_fs_open(NULL,
                 &fs_req,
                 "stdout_file",
                 O_CREAT | O_RDWR,
                 S_IRUSR | S_IWUSR,
                 NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);
  file = dup2(file, STDERR_FILENO);
  ASSERT_NE(file, -1);

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.file = file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT_EQ(27, r);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strcmp("hello world\nhello errworld\n", output));

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}